

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O0

string_view __thiscall
cinatra::websocket::encode_frame
          (websocket *this,span<char,_18446744073709551615UL> *data,opcode op,bool eof,
          bool need_compression)

{
  span<char,_18446744073709551615UL> *in_RDI;
  string_view sVar1;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  undefined1 unaff_retaddr_01;
  opcode unaff_retaddr_02;
  size_t in_stack_00000008;
  undefined5 in_stack_00000010;
  string_view ws_header;
  
  std::span<char,_18446744073709551615UL>::size((span<char,_18446744073709551615UL> *)0x2cf0a6);
  sVar1 = encode_ws_header((websocket *)
                           CONCAT17(op,CONCAT16(eof,CONCAT15(need_compression,in_stack_00000010))),
                           in_stack_00000008,unaff_retaddr_02,(bool)unaff_retaddr_01,
                           (bool)unaff_retaddr_00,(bool)unaff_retaddr);
  encode_ws_payload((websocket *)sVar1._M_len,in_RDI);
  return sVar1;
}

Assistant:

std::string_view encode_frame(std::span<char> &data, opcode op, bool eof,
                                bool need_compression = false) {
    std::string_view ws_header =
        encode_ws_header(data.size(), op, eof, need_compression);
    encode_ws_payload(data);

    return ws_header;
  }